

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.hpp
# Opt level: O2

bool __thiscall duckdb::interval_t::operator==(interval_t *this,interval_t *right)

{
  bool bVar1;
  int64_t rmicros;
  int64_t rdays;
  int64_t lmicros;
  int64_t ldays;
  int64_t rmonths;
  int64_t lmonths;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  
  if (((this->months != right->months) || (this->days != right->days)) ||
     (bVar1 = true, this->micros != right->micros)) {
    Normalize(this,&local_20,&local_30,&local_38);
    Normalize(right,&local_28,&local_40,&local_48);
    if ((local_20 == local_28) && (local_30 == local_40)) {
      bVar1 = local_38 == local_48;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

inline bool operator==(const interval_t &right) const {
		//	Quick equality check
		const auto &left = *this;
		if (left.months == right.months && left.days == right.days && left.micros == right.micros) {
			return true;
		}

		int64_t lmonths, ldays, lmicros;
		int64_t rmonths, rdays, rmicros;
		left.Normalize(lmonths, ldays, lmicros);
		right.Normalize(rmonths, rdays, rmicros);

		return lmonths == rmonths && ldays == rdays && lmicros == rmicros;
	}